

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void movingAtomListProcessing(atom *initAtomLst,void *userdata)

{
  atom_t *paVar1;
  int iVar2;
  int iVar3;
  int rescnt;
  residue_t *prVar4;
  atom *atomlist;
  char local_e6;
  char prevChain [5];
  chainEndData_t endData;
  
  initEndData(&endData);
  prevChain[0] = '?';
  prevChain[1] = '?';
  prevChain[2] = '\0';
  local_e6 = ' ';
  iVar3 = 0;
  rescnt = 0;
  atomlist = (atom *)0x0;
  while (initAtomLst != (atom *)0x0) {
    paVar1 = initAtomLst->next;
    prVar4 = initAtomLst->r;
    initAtomLst->next = atomlist;
    if (((prVar4->resid != iVar3) || (prVar4->resInsCode != local_e6)) ||
       (iVar2 = strcmp(prVar4->chain,prevChain), iVar2 != 0)) {
      if (rescnt != 0) {
        hisNHcheck(&endData,initAtomLst,rescnt);
        prVar4 = initAtomLst->r;
      }
      iVar3 = strcmp(prVar4->chain,prevChain);
      CtermCheck(&endData,rescnt,(uint)(iVar3 != 0));
      rescnt = rescnt + 1;
      iVar3 = strcmp(initAtomLst->r->chain,prevChain);
      NtermCheck(&endData,rescnt,(uint)(iVar3 != 0));
      prVar4 = initAtomLst->r;
      iVar3 = prVar4->resid;
      local_e6 = prVar4->resInsCode;
      strcpy(prevChain,prVar4->chain);
    }
    prVar4->rescnt = rescnt;
    ProcessResInfo(&endData,initAtomLst);
    atomlist = initAtomLst;
    initAtomLst = paVar1;
  }
  if (rescnt != 0) {
    hisNHcheck(&endData,atomlist,rescnt);
  }
  CtermCheck(&endData,rescnt,1);
  return;
}

Assistant:

void movingAtomListProcessing(atom *initAtomLst, void *userdata)
{
   int previd = 0, rescnt = 0;
   char prevInsCode = ' ';
   char prevChain[5];
   atom *a = NULL, *prevAtomLst = NULL, *nexta = NULL;
   chainEndData_t endData;

   initEndData(&endData);

   prevChain[0] = prevChain[1] = '?';
   prevChain[2] = '\0';

   for(a=initAtomLst; a; a = nexta) {
      nexta = a->next;

      a->next = prevAtomLst; /* remove a from initial atom list */
      prevAtomLst = a;       /* and build up a reversed list of */
                             /* only atoms previously seen      */

      if (a->r->resid != previd || a->r->resInsCode != prevInsCode
                             || strcmp(a->r->chain, prevChain) != 0) {

	 if (rescnt){
	    resCheck(&endData, prevAtomLst, rescnt);
	 }
	 CtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));

	 ++rescnt;

	 NtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));
	 previd = a->r->resid;
	 prevInsCode = a->r->resInsCode;
	 strcpy(prevChain, a->r->chain);
         //prevChain[2] = '\0';
      }
      a->r->rescnt = rescnt;

      ProcessResInfo(&endData, a);
   }

   if (rescnt) { resCheck(&endData, prevAtomLst, rescnt); }
   CtermCheck(&endData, rescnt, TRUE);
}